

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  int iVar1;
  Printer *pPVar2;
  long *plVar3;
  long lVar4;
  FileDescriptor *pFVar5;
  char *pcVar6;
  ulong uVar7;
  EnumDescriptor *enum_descriptor;
  long lVar8;
  long lVar9;
  ulong uVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_c8;
  string local_a8;
  long local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar5 = this->file_;
  buffer = &local_80.first.field_2;
  if (0 < *(int *)(pFVar5 + 0x30)) {
    lVar8 = 0;
    do {
      enum_descriptor = (EnumDescriptor *)(lVar8 * 0x50 + *(long *)(pFVar5 + 0x70));
      PrintEnum(this,enum_descriptor);
      pPVar2 = this->printer_;
      anon_unknown_0::ResolveKeyword(&local_80.first,*(string **)enum_descriptor);
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_a8,this,enum_descriptor);
      io::Printer::Print<char[5],std::__cxx11::string,char[16],std::__cxx11::string>
                (pPVar2,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                 (char (*) [5])0x3958cc,&local_80.first,(char (*) [16])0x3a5037,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != buffer) {
        operator_delete(local_80.first._M_dataplus._M_p);
      }
      io::Printer::Print<>(this->printer_,"\n");
      local_88 = lVar8;
      if (0 < *(int *)(enum_descriptor + 0x2c)) {
        lVar8 = 0x10;
        lVar9 = 0;
        do {
          plVar3 = *(long **)(*(long *)(enum_descriptor + 0x30) + -0x10 + lVar8);
          iVar1 = *(int *)(*(long *)(enum_descriptor + 0x30) + lVar8);
          lVar4 = *plVar3;
          local_80.first._M_dataplus._M_p = (pointer)buffer;
          std::__cxx11::string::_M_construct<char*>((string *)&local_80,lVar4,plVar3[1] + lVar4);
          local_80.second = iVar1;
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::pair<std::__cxx11::string,int>>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)&local_c8,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != buffer) {
            operator_delete(local_80.first._M_dataplus._M_p);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x28;
        } while (lVar9 < *(int *)(enum_descriptor + 0x2c));
      }
      lVar8 = local_88 + 1;
      pFVar5 = this->file_;
    } while (lVar8 < *(int *)(pFVar5 + 0x30));
  }
  if (local_c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      pPVar2 = this->printer_;
      anon_unknown_0::ResolveKeyword
                (&local_a8,
                 (string *)
                 ((long)&((local_c8.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar8));
      local_80.first._M_dataplus._M_p = (pointer)buffer;
      pcVar6 = FastInt32ToBufferLeft
                         (*(int32 *)((long)&(local_c8.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->second +
                                    lVar8),buffer->_M_local_buf);
      local_80.first._M_string_length = (long)pcVar6 - (long)buffer;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_80.first._M_dataplus._M_p,
                 local_80.first._M_dataplus._M_p + local_80.first._M_string_length);
      io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
                (pPVar2,"$name$ = $value$\n",(char (*) [5])0x3958cc,&local_a8,(char (*) [6])0x3e5d42
                 ,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      uVar7 = ((long)local_c8.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      lVar8 = lVar8 + 0x28;
    } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
  }
  io::Printer::Print<>(this->printer_,"\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

std::string ModuleAlias(const std::string& filename) {
  std::string module_name = ModuleName(filename);
  // We can't have dots in the module name, so we replace each with _dot_.
  // But that could lead to a collision between a.b and a_dot_b, so we also
  // duplicate each underscore.
  GlobalReplaceSubstring("_", "__", &module_name);
  GlobalReplaceSubstring(".", "_dot_", &module_name);
  return module_name;
}